

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::Reset(Clipper *this)

{
  long64 *plVar1;
  code *pcVar2;
  
  ClipperBase::Reset((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
  this->m_Scanbeam = (Scanbeam *)0x0;
  this->m_ActiveEdges = (TEdge *)0x0;
  this->m_SortedEdges = (TEdge *)0x0;
  DisposeAllPolyPts(this);
  pcVar2 = this->_vptr_Clipper[-3] + 8 +
           (long)&(this->m_PolyOuts).
                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>;
  while (plVar1 = *(long64 **)pcVar2, plVar1 != (long64 *)0x0) {
    InsertScanbeam(this,*plVar1);
    InsertScanbeam(this,*(long64 *)(plVar1[1] + 0x28));
    pcVar2 = (code *)(plVar1 + 3);
  }
  return;
}

Assistant:

void Clipper::Reset()
{
  ClipperBase::Reset();
  m_Scanbeam = 0;
  m_ActiveEdges = 0;
  m_SortedEdges = 0;
  DisposeAllPolyPts();
  LocalMinima* lm = m_MinimaList;
  while (lm)
  {
    InsertScanbeam(lm->Y);
    InsertScanbeam(lm->leftBound->ytop);
    lm = lm->next;
  }
}